

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

bool __thiscall
QDirSortItemComparator::operator()(QDirSortItemComparator *this,QDirSortItem *n1,QDirSortItem *n2)

{
  Data DVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  qint64 qVar7;
  qint64 qVar8;
  CaseSensitivity cs;
  uint uVar9;
  uint uVar10;
  long in_FS_OFFSET;
  QDateTime firstModified;
  QDateTime secondModified;
  Data local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  Data local_48;
  Data local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = (this->qt_cmp_si_sort_flags).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
          super_QFlagsStorage<QDir::SortFlag>.i;
  if ((uVar9 & 4) != 0) {
    bVar4 = QFileInfo::isDir(&n1->item);
    bVar5 = QFileInfo::isDir(&n2->item);
    if (bVar4 != bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        bVar4 = QFileInfo::isDir(&n1->item);
        return bVar4;
      }
      goto LAB_00224f22;
    }
    uVar9 = (this->qt_cmp_si_sort_flags).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
            super_QFlagsStorage<QDir::SortFlag>.i;
  }
  if ((uVar9 & 0x20) == 0) {
LAB_00224ca5:
    uVar10 = uVar9 & 0x83;
    cs = (CaseSensitivity)((uVar9 & 0x10) == 0);
    if (uVar10 == 0x80) {
      iVar6 = compareStrings(this,&n1->suffix_cache,&n2->suffix_cache,cs);
      qVar7 = (qint64)iVar6;
    }
    else if (uVar10 == 2) {
      qVar7 = QFileInfo::size(&n2->item);
      qVar8 = QFileInfo::size(&n1->item);
      qVar7 = qVar7 - qVar8;
    }
    else if (uVar10 == 1) {
      local_68.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = (Data)0x2;
      QFileInfo::fileTime((QFileInfo *)&local_68.data,(int)n1 + 0x30,(QTimeZone *)0x3);
      QTimeZone::~QTimeZone((QTimeZone *)&local_40.s);
      local_40.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = (Data)0x2;
      QFileInfo::fileTime((QFileInfo *)&local_40.s,(int)n2 + 0x30,(QTimeZone *)0x3);
      QTimeZone::~QTimeZone((QTimeZone *)&local_48.s);
      qVar7 = QDateTime::msecsTo((QDateTime *)&local_68.data,(QDateTime *)&local_40.s);
      QDateTime::~QDateTime((QDateTime *)&local_40.s);
      QDateTime::~QDateTime((QDateTime *)&local_68.data);
    }
    else {
      qVar7 = 0;
    }
    if ((uVar10 != 3) && (qVar7 == 0)) {
      if ((n1->filename_cache).d.ptr == (char16_t *)0x0) {
        QFileInfo::fileName((QString *)&local_68.data,&n1->item);
        DVar1.data = (ShortData)(n1->filename_cache).d.d;
        pcVar2 = (n1->filename_cache).d.ptr;
        (n1->filename_cache).d.d = (Data *)local_68;
        (n1->filename_cache).d.ptr = pcStack_60;
        qVar3 = (n1->filename_cache).d.size;
        (n1->filename_cache).d.size = local_58;
        local_68.data = DVar1.data;
        pcStack_60 = pcVar2;
        local_58 = qVar3;
        if (DVar1.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(DVar1.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
          _M_i = (((QBasicAtomicInt *)&(DVar1.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(DVar1.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)DVar1.d,2,0x10);
          }
        }
      }
      if ((n2->filename_cache).d.ptr == (char16_t *)0x0) {
        QFileInfo::fileName((QString *)&local_68.data,&n2->item);
        DVar1.data = (ShortData)(n2->filename_cache).d.d;
        pcVar2 = (n2->filename_cache).d.ptr;
        (n2->filename_cache).d.d = (Data *)local_68;
        (n2->filename_cache).d.ptr = pcStack_60;
        qVar3 = (n2->filename_cache).d.size;
        (n2->filename_cache).d.size = local_58;
        local_68.data = DVar1.data;
        pcStack_60 = pcVar2;
        local_58 = qVar3;
        if (DVar1.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(DVar1.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
          _M_i = (((QBasicAtomicInt *)&(DVar1.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(DVar1.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)DVar1.d,2,0x10);
          }
        }
      }
      iVar6 = compareStrings(this,&n1->filename_cache,&n2->filename_cache,cs);
      qVar7 = (qint64)iVar6;
    }
    bVar4 = 0 < qVar7;
    if (((this->qt_cmp_si_sort_flags).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
         super_QFlagsStorage<QDir::SortFlag>.i & 8) == 0) {
      bVar4 = qVar7 < 0;
    }
  }
  else {
    bVar4 = QFileInfo::isDir(&n1->item);
    bVar5 = QFileInfo::isDir(&n2->item);
    if (bVar4 == bVar5) {
      uVar9 = (this->qt_cmp_si_sort_flags).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
              super_QFlagsStorage<QDir::SortFlag>.i;
      goto LAB_00224ca5;
    }
    bVar4 = QFileInfo::isDir(&n1->item);
    bVar4 = !bVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
LAB_00224f22:
  __stack_chk_fail();
}

Assistant:

bool QDirSortItemComparator::operator()(const QDirSortItem &n1, const QDirSortItem &n2) const
{
    const QDirSortItem* f1 = &n1;
    const QDirSortItem* f2 = &n2;

    if ((qt_cmp_si_sort_flags & QDir::DirsFirst) && (f1->item.isDir() != f2->item.isDir()))
        return f1->item.isDir();
    if ((qt_cmp_si_sort_flags & QDir::DirsLast) && (f1->item.isDir() != f2->item.isDir()))
        return !f1->item.isDir();

    const bool ic = qt_cmp_si_sort_flags.testAnyFlag(QDir::IgnoreCase);
    const auto qtcase = ic ? Qt::CaseInsensitive : Qt::CaseSensitive;

    qint64 r = 0;
    int sortBy = ((qt_cmp_si_sort_flags & QDir::SortByMask)
                 | (qt_cmp_si_sort_flags & QDir::Type)).toInt();

    switch (sortBy) {
      case QDir::Time: {
        const QDateTime firstModified = f1->item.lastModified(QTimeZone::UTC);
        const QDateTime secondModified = f2->item.lastModified(QTimeZone::UTC);
        r = firstModified.msecsTo(secondModified);
        break;
      }
      case QDir::Size:
          r = f2->item.size() - f1->item.size();
        break;
    case QDir::Type:
        r = compareStrings(f1->suffix_cache, f2->suffix_cache, qtcase);
        break;
      default:
        ;
    }

    if (r == 0 && sortBy != QDir::Unsorted) {
        // Still not sorted - sort by name

        if (f1->filename_cache.isNull())
            f1->filename_cache = f1->item.fileName();
        if (f2->filename_cache.isNull())
            f2->filename_cache = f2->item.fileName();

        r = compareStrings(f1->filename_cache, f2->filename_cache, qtcase);
    }
    if (qt_cmp_si_sort_flags & QDir::Reversed)
        return r > 0;
    return r < 0;
}